

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

void llb_build_key_get_directory_tree_structure_signature_path
               (llb_build_key_t *key,llb_data_t *out_path)

{
  uint8_t *puVar1;
  StringRef path;
  StringRef local_40;
  string local_30;
  
  local_40 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath((BuildKey *)(key + 0x10));
  out_path->length = local_40.Length;
  llvm::StringRef::str_abi_cxx11_(&local_30,&local_40);
  puVar1 = (uint8_t *)strdup(local_30._M_dataplus._M_p);
  out_path->data = puVar1;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_build_key_get_directory_tree_structure_signature_path(llb_build_key_t *key, llb_data_t *out_path) {
  auto path = ((CAPIBuildKey *)key)->getInternalBuildKey().getFilteredDirectoryPath();
  out_path->length = path.size();
  out_path->data = (const uint8_t*)strdup(path.str().c_str());
}